

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O2

bool device_is_ready(int device_num)

{
  bool bVar1;
  int32_t iVar2;
  long lVar3;
  ulong uVar4;
  
  std::mutex::lock(&RTLsMtx);
  lVar3 = (long)Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                super__Vector_impl_data._M_start;
  pthread_mutex_unlock((pthread_mutex_t *)&RTLsMtx);
  uVar4 = (ulong)device_num;
  if (uVar4 < (ulong)(lVar3 / 0x118)) {
    if (Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4].IsInit == false) {
      iVar2 = DeviceTy::initOnce(Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar4);
      if (iVar2 != 0) goto LAB_00102f4f;
    }
    bVar1 = true;
  }
  else {
LAB_00102f4f:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool device_is_ready(int device_num) {
  DP("Checking whether device %d is ready.\n", device_num);
  // Devices.size() can only change while registering a new
  // library, so try to acquire the lock of RTLs' mutex.
  RTLsMtx.lock();
  size_t Devices_size = Devices.size();
  RTLsMtx.unlock();
  if (Devices_size <= (size_t)device_num) {
    DP("Device ID  %d does not have a matching RTL\n", device_num);
    return false;
  }

  // Get device info
  DeviceTy &Device = Devices[device_num];

  DP("Is the device %d (local ID %d) initialized? %d\n", device_num,
       Device.RTLDeviceID, Device.IsInit);

  // Init the device if not done before
  if (!Device.IsInit && Device.initOnce() != OFFLOAD_SUCCESS) {
    DP("Failed to init device %d\n", device_num);
    return false;
  }

  DP("Device %d is ready to use.\n", device_num);

  return true;
}